

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psmodule.c
# Opt level: O0

FT_UInt ps_unicodes_char_index(PS_Unicodes table,FT_UInt32 unicode)

{
  PS_UniMap *pPVar1;
  uint uVar2;
  PS_UniMap *pPVar3;
  PS_UniMap *pPStack_40;
  FT_UInt32 base_glyph;
  PS_UniMap *result;
  PS_UniMap *mid;
  PS_UniMap *max;
  PS_UniMap *min;
  FT_UInt32 unicode_local;
  PS_Unicodes table_local;
  
  pPStack_40 = (PS_UniMap *)0x0;
  max = table->maps;
  mid = max + ((ulong)table->num_maps - 1);
  while ((pPVar1 = pPStack_40, max <= mid &&
         (pPVar3 = max + ((long)mid - (long)max >> 4), pPVar1 = pPVar3, pPVar3->unicode != unicode))
        ) {
    uVar2 = pPVar3->unicode & 0x7fffffff;
    if (uVar2 == unicode) {
      pPStack_40 = pPVar3;
    }
    pPVar1 = pPStack_40;
    if (max == mid) break;
    if (uVar2 < unicode) {
      max = pPVar3 + 1;
    }
    else {
      mid = pPVar3 + -1;
    }
  }
  pPStack_40 = pPVar1;
  if (pPStack_40 == (PS_UniMap *)0x0) {
    table_local._4_4_ = 0;
  }
  else {
    table_local._4_4_ = pPStack_40->glyph_index;
  }
  return table_local._4_4_;
}

Assistant:

static FT_UInt
  ps_unicodes_char_index( PS_Unicodes  table,
                          FT_UInt32    unicode )
  {
    PS_UniMap  *min, *max, *mid, *result = NULL;


    /* Perform a binary search on the table. */

    min = table->maps;
    max = min + table->num_maps - 1;

    while ( min <= max )
    {
      FT_UInt32  base_glyph;


      mid = min + ( ( max - min ) >> 1 );

      if ( mid->unicode == unicode )
      {
        result = mid;
        break;
      }

      base_glyph = BASE_GLYPH( mid->unicode );

      if ( base_glyph == unicode )
        result = mid; /* remember match but continue search for base glyph */

      if ( min == max )
        break;

      if ( base_glyph < unicode )
        min = mid + 1;
      else
        max = mid - 1;
    }

    if ( result )
      return result->glyph_index;
    else
      return 0;
  }